

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyStrnicmp(char *zLeft,char *zRight,sxu32 SLen)

{
  ushort **ppuVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  uint local_7c;
  uint local_74;
  uint local_70;
  uint local_68;
  uint local_64;
  uint local_5c;
  uint local_58;
  uint local_50;
  uint local_4c;
  uint local_44;
  sxi32 local_40;
  byte *local_38;
  uchar *q;
  uchar *p;
  sxu32 SLen_local;
  char *zRight_local;
  char *zLeft_local;
  
  if ((((zLeft == (char *)0x0) || (*zLeft == '\0')) || (zRight == (char *)0x0)) ||
     (local_38 = (byte *)zRight, q = (uchar *)zLeft, p._4_4_ = SLen, *zRight == '\0')) {
    if ((zLeft == (char *)0x0) || (*zLeft == '\0')) {
      bVar4 = true;
      if (zRight != (char *)0x0) {
        bVar4 = *zRight == '\0';
      }
      local_40 = -1;
      if (bVar4) {
        local_40 = 0;
      }
    }
    else {
      local_40 = 1;
    }
    zLeft_local._4_4_ = local_40;
  }
  else {
    for (; p._4_4_ != 0; p._4_4_ = p._4_4_ - 4) {
      pbVar3 = local_38;
      pbVar2 = q;
      if ((*q == '\0') || (*local_38 == 0)) {
LAB_0011d149:
        q = pbVar2;
        local_38 = pbVar3;
        if ((*q < 0xc0) && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*q] & 0x100) != 0)) {
          local_74 = tolower((uint)*q);
        }
        else {
          local_74 = (uint)*q;
        }
        if ((*local_38 < 0xc0) &&
           (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*local_38] & 0x100) != 0)) {
          local_7c = tolower((uint)*local_38);
        }
        else {
          local_7c = (uint)*local_38;
        }
        return local_74 - local_7c;
      }
      if ((*q < 0xc0) && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*q] & 0x100) != 0)) {
        local_44 = tolower((uint)*q);
      }
      else {
        local_44 = (uint)*q;
      }
      if ((*local_38 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*local_38] & 0x100) != 0)) {
        local_4c = tolower((uint)*local_38);
      }
      else {
        local_4c = (uint)*local_38;
      }
      if (local_44 != local_4c) goto LAB_0011d149;
      pbVar2 = q + 1;
      pbVar3 = local_38 + 1;
      if (p._4_4_ == 1) {
        return 0;
      }
      if ((*pbVar2 == 0) || (*pbVar3 == 0)) goto LAB_0011d149;
      if ((*pbVar2 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar2] & 0x100) != 0)) {
        local_50 = tolower((uint)*pbVar2);
      }
      else {
        local_50 = (uint)*pbVar2;
      }
      if ((*pbVar3 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar3] & 0x100) != 0)) {
        local_58 = tolower((uint)*pbVar3);
      }
      else {
        local_58 = (uint)*pbVar3;
      }
      if (local_50 != local_58) goto LAB_0011d149;
      pbVar2 = q + 2;
      pbVar3 = local_38 + 2;
      if (p._4_4_ == 2) {
        return 0;
      }
      if ((*pbVar2 == 0) || (*pbVar3 == 0)) goto LAB_0011d149;
      if ((*pbVar2 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar2] & 0x100) != 0)) {
        local_5c = tolower((uint)*pbVar2);
      }
      else {
        local_5c = (uint)*pbVar2;
      }
      if ((*pbVar3 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar3] & 0x100) != 0)) {
        local_64 = tolower((uint)*pbVar3);
      }
      else {
        local_64 = (uint)*pbVar3;
      }
      if (local_5c != local_64) goto LAB_0011d149;
      pbVar2 = q + 3;
      pbVar3 = local_38 + 3;
      if (p._4_4_ == 3) {
        return 0;
      }
      if ((*pbVar2 == 0) || (*pbVar3 == 0)) goto LAB_0011d149;
      if ((*pbVar2 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar2] & 0x100) != 0)) {
        local_68 = tolower((uint)*pbVar2);
      }
      else {
        local_68 = (uint)*pbVar2;
      }
      if ((*pbVar3 < 0xc0) &&
         (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*pbVar3] & 0x100) != 0)) {
        local_70 = tolower((uint)*pbVar3);
      }
      else {
        local_70 = (uint)*pbVar3;
      }
      if (local_68 != local_70) goto LAB_0011d149;
      q = q + 4;
      local_38 = local_38 + 4;
    }
    zLeft_local._4_4_ = 0;
  }
  return zLeft_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyStrnicmp(const char *zLeft, const char *zRight, sxu32 SLen)
{
  	register unsigned char *p = (unsigned char *)zLeft;
	register unsigned char *q = (unsigned char *)zRight;
	
	if( SX_EMPTY_STR(p) || SX_EMPTY_STR(q) ){
		return SX_EMPTY_STR(p)? SX_EMPTY_STR(q) ? 0 : -1 :1;
	}
	for(;;){
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		
	}
	return (sxi32)(SyCharToLower(p[0]) - SyCharToLower(q[0]));
}